

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::has_extension(Twine *path,Style style)

{
  bool bVar1;
  StringRef path_00;
  StringRef SVar2;
  StringRef local_d8 [2];
  path *ppStack_b8;
  StringRef p;
  SmallString<128U> path_storage;
  Style style_local;
  Twine *path_local;
  
  SmallString<128U>::SmallString((SmallString<128U> *)&p.Length);
  SVar2 = Twine::toStringRef(path,(SmallVectorImpl<char> *)&p.Length);
  p.Data = (char *)SVar2.Length;
  ppStack_b8 = (path *)SVar2.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = p.Data;
  path_00.Length._4_4_ = 0;
  local_d8[0] = extension(ppStack_b8,path_00,(Style)SVar2.Data);
  bVar1 = StringRef::empty(local_d8);
  SmallString<128U>::~SmallString((SmallString<128U> *)&p.Length);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool has_extension(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !extension(p, style).empty();
}